

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_lazy.c
# Opt level: O3

size_t ZSTD_compressBlock_lazy_dictMatchState
                 (ZSTD_matchState_t *ms,seqStore_t *seqStore,U32 *rep,void *src,size_t srcSize)

{
  int *iEnd;
  undefined8 *puVar1;
  ZSTD_matchState_t *pZVar2;
  undefined8 uVar3;
  long lVar4;
  seqStore_t *psVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  size_t sVar9;
  ulong uVar10;
  ulong uVar11;
  int iVar12;
  int *piVar13;
  int *mEnd;
  BYTE *pBVar14;
  int iVar15;
  long lVar16;
  BYTE *pBVar17;
  int *piVar18;
  uint uVar19;
  ulong uVar20;
  int *piVar21;
  seqDef *psVar22;
  uint uVar23;
  ulong uVar24;
  size_t ofbCandidate;
  uint local_f0;
  size_t local_e0;
  uint local_d4;
  ulong local_d0;
  ZSTD_matchState_t *local_c8;
  seqStore_t *local_c0;
  BYTE *local_b8;
  int *local_b0;
  int *local_a8;
  BYTE *local_a0;
  int *local_98;
  BYTE *local_90;
  uint local_84;
  BYTE *local_80;
  int *local_78;
  uint *local_70;
  ulong local_68;
  ulong local_60;
  ulong local_58;
  BYTE *local_50;
  ulong local_48;
  ulong local_40;
  ulong local_38;
  
  local_b8 = (ms->window).base;
  uVar8 = (ms->window).dictLimit;
  local_d0 = (ulong)uVar8;
  uVar6 = (ms->cParams).minMatch;
  uVar7 = 6;
  if (uVar6 < 6) {
    uVar7 = uVar6;
  }
  uVar6 = 4;
  if (4 < uVar7) {
    uVar6 = uVar7;
  }
  local_a0 = local_b8 + local_d0;
  local_f0 = *rep;
  pZVar2 = ms->dictMatchState;
  local_a8 = (int *)(pZVar2->window).nextSrc;
  local_90 = (pZVar2->window).base;
  local_50 = local_90 + (pZVar2->window).dictLimit;
  iVar15 = (int)local_a8;
  uVar7 = ((int)src - ((int)local_a0 + (int)local_50)) + iVar15;
  piVar13 = (int *)((long)src + (ulong)(uVar7 == 0));
  if (uVar7 < local_f0) {
    __assert_fail("offset_1 <= dictAndPrefixLength",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_lazy.c"
                  ,0x603,
                  "size_t ZSTD_compressBlock_lazy_generic(ZSTD_matchState_t *, seqStore_t *, U32 *, const void *, size_t, const searchMethod_e, const U32, const ZSTD_dictMode_e)"
                 );
  }
  uVar19 = rep[1];
  if (uVar7 < uVar19) {
    __assert_fail("offset_2 <= dictAndPrefixLength",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_lazy.c"
                  ,0x604,
                  "size_t ZSTD_compressBlock_lazy_generic(ZSTD_matchState_t *, seqStore_t *, U32 *, const void *, size_t, const searchMethod_e, const U32, const ZSTD_dictMode_e)"
                 );
  }
  iEnd = (int *)(srcSize + (long)src);
  local_b0 = (int *)((long)src + (srcSize - 8));
  ms->lazySkipping = 0;
  if (piVar13 < local_b0) {
    local_84 = ((int)local_90 - iVar15) + uVar8;
    local_80 = local_90 + -(ulong)local_84;
    local_78 = iEnd + -8;
    iVar12 = (int)local_b8;
    local_58 = (ulong)((1 - uVar8) - iVar12);
    local_60 = (ulong)(uint)-iVar12;
    local_68 = (ulong)((((iVar15 - uVar8) - (int)local_90) - iVar12) + 1);
    local_c8 = ms;
    local_c0 = seqStore;
    local_70 = rep;
    do {
      uVar8 = (((int)piVar13 - (int)local_b8) - local_f0) + 1;
      piVar18 = (int *)(local_b8 + uVar8);
      if (uVar8 < (uint)local_d0) {
        piVar18 = (int *)(local_90 + (uVar8 - local_84));
      }
      local_d4 = uVar19;
      local_98 = piVar13;
      if ((uVar8 - (uint)local_d0 < 0xfffffffd) && (*piVar18 == *(int *)((long)piVar13 + 1))) {
        piVar21 = iEnd;
        if (uVar8 < (uint)local_d0) {
          piVar21 = local_a8;
        }
        sVar9 = ZSTD_count_2segments
                          ((BYTE *)((long)piVar13 + 5),(BYTE *)(piVar18 + 1),(BYTE *)iEnd,
                           (BYTE *)piVar21,local_a0);
        uVar20 = sVar9 + 4;
      }
      else {
        uVar20 = 0;
      }
      pZVar2 = local_c8;
      local_e0 = 999999999;
      if (uVar6 == 6) {
        uVar10 = ZSTD_HcFindBestMatch_dictMatchState_6
                           (local_c8,(BYTE *)local_98,(BYTE *)iEnd,&local_e0);
      }
      else if (uVar6 == 5) {
        uVar10 = ZSTD_HcFindBestMatch_dictMatchState_5
                           (local_c8,(BYTE *)local_98,(BYTE *)iEnd,&local_e0);
      }
      else {
        uVar10 = ZSTD_HcFindBestMatch_dictMatchState_4
                           (local_c8,(BYTE *)local_98,(BYTE *)iEnd,&local_e0);
      }
      uVar11 = uVar20;
      if (uVar20 < uVar10) {
        uVar11 = uVar10;
      }
      if (uVar11 < 4) {
        pZVar2->lazySkipping = (uint)(0x7ff < (ulong)((long)local_98 - (long)src));
        piVar13 = (int *)((long)local_98 + ((ulong)((long)local_98 - (long)src) >> 8) + 1);
        uVar19 = local_d4;
      }
      else {
        piVar18 = local_98;
        uVar24 = local_e0;
        if (uVar10 <= uVar20) {
          piVar18 = (int *)((long)piVar13 + 1);
          uVar24 = 1;
        }
        uVar20 = uVar11;
        if (local_98 < local_b0) {
          iVar15 = (int)local_98;
          local_38 = (ulong)(((int)local_58 + iVar15) - local_f0);
          local_40 = (ulong)(((int)local_60 + iVar15) - local_f0);
          local_48 = (ulong)(((int)local_68 + iVar15) - local_f0);
          lVar16 = 0;
          do {
            piVar21 = (int *)((long)local_98 + lVar16 + 1);
            iVar15 = (int)lVar16;
            uVar8 = (int)local_40 + iVar15 + 1;
            piVar13 = (int *)(local_b8 + uVar8);
            if (uVar8 < (uint)local_d0) {
              piVar13 = (int *)(local_90 + (uint)((int)local_48 + iVar15));
            }
            uVar20 = uVar11;
            if (((uint)((int)local_38 + iVar15) < 0xfffffffd) && (*piVar13 == *piVar21)) {
              mEnd = iEnd;
              if (uVar8 < (uint)local_d0) {
                mEnd = local_a8;
              }
              sVar9 = ZSTD_count_2segments
                                ((BYTE *)((long)local_98 + lVar16 + 5),(BYTE *)(piVar13 + 1),
                                 (BYTE *)iEnd,(BYTE *)mEnd,local_a0);
              uVar8 = (uint)uVar24;
              if (uVar8 == 0) goto LAB_001d85fd;
              if (sVar9 < 0xfffffffffffffffc) {
                uVar7 = 0x1f;
                if (uVar8 != 0) {
                  for (; uVar8 >> uVar7 == 0; uVar7 = uVar7 - 1) {
                  }
                }
                if ((int)((uVar7 ^ 0x1f) + (int)uVar11 * 3 + -0x1e) < (int)(sVar9 + 4) * 3) {
                  uVar24 = 1;
                  piVar18 = piVar21;
                  uVar20 = sVar9 + 4;
                }
              }
            }
            local_e0 = 999999999;
            if (uVar6 == 6) {
              uVar11 = ZSTD_HcFindBestMatch_dictMatchState_6
                                 (local_c8,(BYTE *)piVar21,(BYTE *)iEnd,&local_e0);
            }
            else if (uVar6 == 5) {
              uVar11 = ZSTD_HcFindBestMatch_dictMatchState_5
                                 (local_c8,(BYTE *)piVar21,(BYTE *)iEnd,&local_e0);
            }
            else {
              uVar11 = ZSTD_HcFindBestMatch_dictMatchState_4
                                 (local_c8,(BYTE *)piVar21,(BYTE *)iEnd,&local_e0);
            }
            uVar8 = (uint)local_e0;
            if ((uVar8 == 0) || (uVar7 = (uint)uVar24, uVar7 == 0)) {
LAB_001d85fd:
              __assert_fail("val != 0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/../common/bits.h"
                            ,0xab,"unsigned int ZSTD_highbit32(U32)");
            }
            if (uVar11 < 4) goto LAB_001d8235;
            iVar15 = 0x1f;
            if (uVar8 != 0) {
              for (; uVar8 >> iVar15 == 0; iVar15 = iVar15 + -1) {
              }
            }
            uVar8 = 0x1f;
            if (uVar7 != 0) {
              for (; uVar7 >> uVar8 == 0; uVar8 = uVar8 - 1) {
              }
            }
            if ((int)uVar11 * 4 - iVar15 <= (int)((uVar8 ^ 0x1f) + (int)uVar20 * 4 + -0x1b))
            goto LAB_001d8235;
            lVar4 = lVar16 + 1;
            lVar16 = lVar16 + 1;
            piVar18 = piVar21;
            uVar24 = local_e0;
          } while ((int *)((long)local_98 + lVar4) < local_b0);
          piVar18 = (int *)((long)local_98 + lVar16);
          uVar20 = uVar11;
        }
LAB_001d8235:
        uVar8 = local_d4;
        if (3 < uVar24) {
          uVar10 = (long)piVar18 + (-(long)local_b8 - uVar24) + -0xfffffffd;
          pBVar14 = local_b8;
          pBVar17 = local_a0;
          if ((uint)uVar10 < (uint)local_d0) {
            pBVar14 = local_80;
            pBVar17 = local_50;
          }
          if ((src < piVar18) && (uVar10 = uVar10 & 0xffffffff, pBVar17 < pBVar14 + uVar10)) {
            pBVar14 = pBVar14 + uVar10;
            do {
              piVar13 = (int *)((long)piVar18 + -1);
              pBVar14 = pBVar14 + -1;
              if ((*(BYTE *)piVar13 != *pBVar14) ||
                 (uVar20 = uVar20 + 1, piVar18 = piVar13, piVar13 <= src)) break;
            } while (pBVar17 < pBVar14);
          }
          uVar8 = local_f0;
          local_f0 = (U32)uVar24 - 3;
        }
        if (local_c0->maxNbSeq <=
            (ulong)((long)local_c0->sequences - (long)local_c0->sequencesStart >> 3)) {
LAB_001d865a:
          __assert_fail("(size_t)(seqStorePtr->sequences - seqStorePtr->sequencesStart) < seqStorePtr->maxNbSeq"
                        ,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                        ,0x29d,
                        "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                       );
        }
        local_d4 = uVar8;
        if (0x20000 < local_c0->maxNbLit) {
LAB_001d863b:
          __assert_fail("seqStorePtr->maxNbLit <= 128 KB",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                        ,0x29f,
                        "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                       );
        }
        uVar10 = (long)piVar18 - (long)src;
        pBVar17 = local_c0->lit;
        if (local_c0->litStart + local_c0->maxNbLit < pBVar17 + uVar10) {
LAB_001d8679:
          __assert_fail("seqStorePtr->lit + litLength <= seqStorePtr->litStart + seqStorePtr->maxNbLit"
                        ,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                        ,0x2a0,
                        "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                       );
        }
        if (iEnd < piVar18) {
LAB_001d8698:
          __assert_fail("literals + litLength <= litLimit",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                        ,0x2a1,
                        "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                       );
        }
        if (local_78 < piVar18) {
          ZSTD_safecopyLiterals(pBVar17,(BYTE *)src,(BYTE *)piVar18,(BYTE *)local_78);
LAB_001d833b:
          local_c0->lit = local_c0->lit + uVar10;
          if (0xffff < uVar10) {
            if (local_c0->longLengthType != ZSTD_llt_none) {
              __assert_fail("seqStorePtr->longLengthType == ZSTD_llt_none",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                            ,0x2b2,
                            "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                           );
            }
            local_c0->longLengthType = ZSTD_llt_literalLength;
            local_c0->longLengthPos =
                 (U32)((ulong)((long)local_c0->sequences - (long)local_c0->sequencesStart) >> 3);
          }
        }
        else {
          uVar3 = *(undefined8 *)((long)src + 8);
          *(undefined8 *)pBVar17 = *src;
          *(undefined8 *)(pBVar17 + 8) = uVar3;
          pBVar17 = local_c0->lit;
          if (0x10 < uVar10) {
            if ((BYTE *)0xffffffffffffffe0 < pBVar17 + 0x10 + (-0x10 - ((long)src + 0x10))) {
              __assert_fail("diff >= WILDCOPY_VECLEN || diff <= -WILDCOPY_VECLEN",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/../common/zstd_internal.h"
                            ,0xe9,
                            "void ZSTD_wildcopy(void *, const void *, ptrdiff_t, const ZSTD_overlap_e)"
                           );
            }
            uVar3 = *(undefined8 *)((long)src + 0x18);
            *(undefined8 *)(pBVar17 + 0x10) = *(undefined8 *)((long)src + 0x10);
            *(undefined8 *)(pBVar17 + 0x18) = uVar3;
            if (0x20 < (long)uVar10) {
              lVar16 = 0;
              do {
                puVar1 = (undefined8 *)((long)src + lVar16 + 0x20);
                uVar3 = puVar1[1];
                pBVar14 = pBVar17 + lVar16 + 0x20;
                *(undefined8 *)pBVar14 = *puVar1;
                *(undefined8 *)(pBVar14 + 8) = uVar3;
                puVar1 = (undefined8 *)((long)src + lVar16 + 0x30);
                uVar3 = puVar1[1];
                *(undefined8 *)(pBVar14 + 0x10) = *puVar1;
                *(undefined8 *)(pBVar14 + 0x18) = uVar3;
                lVar16 = lVar16 + 0x20;
              } while (pBVar14 + 0x20 < pBVar17 + uVar10);
            }
            goto LAB_001d833b;
          }
          local_c0->lit = pBVar17 + uVar10;
        }
        psVar5 = local_c0;
        psVar22 = local_c0->sequences;
        psVar22->litLength = (U16)uVar10;
        psVar22->offBase = (U32)uVar24;
        if (uVar20 < 3) {
LAB_001d861c:
          __assert_fail("matchLength >= MINMATCH",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                        ,700,
                        "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                       );
        }
        if (0xffff < uVar20 - 3) {
          if (local_c0->longLengthType != ZSTD_llt_none) {
LAB_001d86b7:
            __assert_fail("seqStorePtr->longLengthType == ZSTD_llt_none",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                          ,0x2bf,
                          "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                         );
          }
          local_c0->longLengthType = ZSTD_llt_matchLength;
          local_c0->longLengthPos =
               (U32)((ulong)((long)psVar22 - (long)local_c0->sequencesStart) >> 3);
        }
        psVar22->mlBase = (U16)(uVar20 - 3);
        psVar22 = psVar22 + 1;
        local_c0->sequences = psVar22;
        if (local_c8->lazySkipping != 0) {
          local_c8->lazySkipping = 0;
        }
        src = (void *)((long)piVar18 + uVar20);
        piVar13 = (int *)src;
        uVar19 = local_d4;
        uVar8 = local_d4;
        if (src <= local_b0) {
          do {
            uVar23 = uVar8;
            uVar8 = local_f0;
            uVar7 = ((int)src - (int)local_b8) - uVar23;
            pBVar17 = local_b8;
            if (uVar7 < (uint)local_d0) {
              pBVar17 = local_80;
            }
            piVar13 = (int *)src;
            uVar19 = uVar23;
            local_f0 = uVar8;
            if ((0xfffffffc < uVar7 - (uint)local_d0) || (*(int *)(pBVar17 + uVar7) != *src)) break;
            piVar13 = iEnd;
            if (uVar7 < (uint)local_d0) {
              piVar13 = local_a8;
            }
            sVar9 = ZSTD_count_2segments
                              ((BYTE *)((long)src + 4),(BYTE *)((long)(pBVar17 + uVar7) + 4),
                               (BYTE *)iEnd,(BYTE *)piVar13,local_a0);
            if (psVar5->maxNbSeq <= (ulong)((long)psVar22 - (long)psVar5->sequencesStart >> 3))
            goto LAB_001d865a;
            if (0x20000 < psVar5->maxNbLit) goto LAB_001d863b;
            pBVar17 = psVar5->lit;
            if (psVar5->litStart + psVar5->maxNbLit < pBVar17) goto LAB_001d8679;
            if (iEnd < src) goto LAB_001d8698;
            if (local_78 < src) {
              ZSTD_safecopyLiterals(pBVar17,(BYTE *)src,(BYTE *)src,(BYTE *)local_78);
            }
            else {
              uVar3 = *(undefined8 *)((long)src + 8);
              *(undefined8 *)pBVar17 = *src;
              *(undefined8 *)(pBVar17 + 8) = uVar3;
            }
            psVar22 = psVar5->sequences;
            psVar22->litLength = 0;
            psVar22->offBase = 1;
            if (sVar9 + 4 < 3) goto LAB_001d861c;
            if (0xffff < sVar9 + 1) {
              if (psVar5->longLengthType != ZSTD_llt_none) goto LAB_001d86b7;
              psVar5->longLengthType = ZSTD_llt_matchLength;
              psVar5->longLengthPos =
                   (U32)((ulong)((long)psVar22 - (long)psVar5->sequencesStart) >> 3);
            }
            psVar22->mlBase = (U16)(sVar9 + 1);
            psVar22 = psVar22 + 1;
            psVar5->sequences = psVar22;
            src = (void *)((long)src + sVar9 + 4);
            piVar13 = (int *)src;
            uVar19 = uVar8;
            local_f0 = uVar23;
          } while (src <= local_b0);
        }
      }
      rep = local_70;
    } while (piVar13 < local_b0);
  }
  *rep = local_f0;
  rep[1] = uVar19;
  return (long)iEnd - (long)src;
}

Assistant:

size_t ZSTD_compressBlock_lazy_dictMatchState(
        ZSTD_matchState_t* ms, seqStore_t* seqStore, U32 rep[ZSTD_REP_NUM],
        void const* src, size_t srcSize)
{
    return ZSTD_compressBlock_lazy_generic(ms, seqStore, rep, src, srcSize, search_hashChain, 1, ZSTD_dictMatchState);
}